

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ArrayPtr<const_char> AVar6;
  StructReader local_88;
  PointerReader local_58;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  bVar5 = (decl->_reader).pointerCount == 0;
  local_58.pointer = (decl->_reader).pointers;
  if (bVar5) {
    local_58.pointer = (WirePointer *)0x0;
  }
  iVar4 = 0x7fffffff;
  local_58.nestingLimit = (decl->_reader).nestingLimit;
  if (bVar5) {
    local_58.nestingLimit = 0x7fffffff;
  }
  else {
    local_58.segment._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(decl->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
  }
  _::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (local_88.pointerCount != 0) {
    local_58.pointer = (WirePointer *)CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers);
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (local_88.pointerCount != 0) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  AVar6 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  (this->name).content = AVar6;
  *(undefined8 *)((long)&(this->declId)._reader.pointers + 6) = 0;
  local_88.segment._0_4_ = 0;
  local_88.segment._4_4_ = 0;
  local_88.capTable._0_4_ = 0;
  local_88.capTable._4_4_ = 0;
  (this->declId)._reader.data = (void *)0x0;
  (this->declId)._reader.pointers = (WirePointer *)0x0;
  (this->declId)._reader.segment = (SegmentReader *)0x0;
  (this->declId)._reader.capTable = (CapTableReader *)0x0;
  (this->declId)._reader.nestingLimit = 0x7fffffff;
  this->declKind = FIELD;
  this->isParam = true;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_88.data = (WirePointer *)0x0;
  if (2 < (decl->_reader).pointerCount) {
    iVar4 = (decl->_reader).nestingLimit;
    local_88.segment._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_88.segment._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    local_88.capTable._0_4_ = *(undefined4 *)&(decl->_reader).capTable;
    local_88.capTable._4_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    local_88.data = (decl->_reader).pointers + 2;
  }
  local_88.pointers._0_4_ = iVar4;
  _::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)&local_88,INLINE_COMPOSITE,(word *)0x0
            );
  uVar1 = (decl->_reader).dataSize;
  if (uVar1 < 0x40) {
    this->startByte = 0;
    uVar3 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar2 + 4);
    uVar3 = 0;
    if (0x5f < uVar1) {
      uVar3 = *(uint *)((long)pvVar2 + 8);
    }
  }
  this->endByte = uVar3;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  bVar5 = (decl->_reader).pointerCount < 2;
  local_58.pointer = (decl->_reader).pointers + 1;
  if (bVar5) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = 0x7fffffff;
  if (!bVar5) {
    local_58.segment._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(decl->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    local_58.nestingLimit = (decl->_reader).nestingLimit;
  }
  _::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
  (this->fieldType)._reader.dataSize = local_88.dataSize;
  (this->fieldType)._reader.pointerCount = local_88.pointerCount;
  *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_88._38_2_;
  *(ulong *)&(this->fieldType)._reader.nestingLimit =
       CONCAT44(local_88._44_4_,local_88.nestingLimit);
  (this->fieldType)._reader.data = local_88.data;
  (this->fieldType)._reader.pointers =
       (WirePointer *)CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers);
  (this->fieldType)._reader.segment =
       (SegmentReader *)CONCAT44(local_88.segment._4_4_,local_88.segment._0_4_);
  (this->fieldType)._reader.capTable =
       (CapTableReader *)CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
  if ((0xf < (decl->_reader).dataSize) && (*(decl->_reader).data == 1)) {
    this->hasDefaultValue = true;
    bVar5 = (decl->_reader).pointerCount < 4;
    local_58.pointer = (decl->_reader).pointers + 3;
    if (bVar5) {
      local_58.pointer = (WirePointer *)0x0;
    }
    local_58.nestingLimit = (decl->_reader).nestingLimit;
    if (bVar5) {
      local_58.segment._0_4_ = 0;
      local_58.segment._4_4_ = 0;
      local_58.capTable._0_4_ = 0;
      local_58.capTable._4_4_ = 0;
      local_58.nestingLimit = 0x7fffffff;
    }
    else {
      local_58.segment._0_4_ = *(undefined4 *)&(decl->_reader).segment;
      local_58.segment._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
      local_58.capTable._0_4_ = *(undefined4 *)&(decl->_reader).capTable;
      local_58.capTable._4_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    }
    _::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
    (this->fieldDefaultValue)._reader.dataSize = local_88.dataSize;
    (this->fieldDefaultValue)._reader.pointerCount = local_88.pointerCount;
    *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_88._38_2_;
    *(ulong *)&(this->fieldDefaultValue)._reader.nestingLimit =
         CONCAT44(local_88._44_4_,local_88.nestingLimit);
    (this->fieldDefaultValue)._reader.data = local_88.data;
    (this->fieldDefaultValue)._reader.pointers =
         (WirePointer *)CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers);
    (this->fieldDefaultValue)._reader.segment =
         (SegmentReader *)CONCAT44(local_88.segment._4_4_,local_88.segment._0_4_);
    (this->fieldDefaultValue)._reader.capTable =
         (CapTableReader *)CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Param::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declKind(Declaration::FIELD), isParam(true),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      fieldType = decl.getType();
      if (decl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = decl.getDefaultValue().getValue();
      }
    }